

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O0

int xmlSchematronValidateDoc(xmlSchematronValidCtxtPtr ctxt,xmlDocPtr instance)

{
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  xmlNodePtr pxVar3;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  xmlXPathCompExprPtr local_48;
  xmlSchematronTestPtr_conflict test;
  xmlSchematronRulePtr_conflict rule;
  xmlSchematronPatternPtr_conflict pattern;
  xmlNodePtr root;
  xmlNodePtr cur;
  xmlDocPtr instance_local;
  xmlSchematronValidCtxtPtr ctxt_local;
  
  if ((((ctxt == (xmlSchematronValidCtxtPtr)0x0) || (ctxt->schema == (xmlSchematronPtr)0x0)) ||
      (ctxt->schema->rules == (xmlSchematronRulePtr_conflict)0x0)) || (instance == (xmlDocPtr)0x0))
  {
    ctxt_local._4_4_ = -1;
  }
  else {
    ctxt->nberrors = 0;
    pxVar3 = xmlDocGetRootElement(instance);
    if (pxVar3 == (xmlNodePtr)0x0) {
      pp_Var4 = __xmlGenericError();
      p_Var1 = *pp_Var4;
      ppvVar5 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar5,"Unimplemented block at %s:%d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/schematron.c"
                ,0x68f);
      ctxt->nberrors = ctxt->nberrors + 1;
      ctxt_local._4_4_ = 1;
    }
    else {
      root = pxVar3;
      if (((ctxt->flags & 1U) == 0) && (ctxt->flags != 0)) {
        for (rule = (xmlSchematronRulePtr_conflict)ctxt->schema->patterns;
            rule != (xmlSchematronRulePtr_conflict)0x0; rule = rule->next) {
          xmlSchematronReportPattern(ctxt,(xmlSchematronPatternPtr_conflict)rule);
          for (root = pxVar3; root != (xmlNodePtr)0x0; root = xmlSchematronNextNode(root)) {
            for (test = (xmlSchematronTestPtr_conflict)rule->patnext;
                test != (xmlSchematronTestPtr_conflict)0x0;
                test = *(xmlSchematronTestPtr_conflict *)&test->type) {
              iVar2 = xmlPatternMatch((xmlPatternPtr)test->report,root);
              if (iVar2 == 1) {
                for (local_48 = test->comp; local_48 != (xmlXPathCompExprPtr)0x0;
                    local_48 = *(xmlXPathCompExprPtr *)local_48) {
                  xmlSchematronRunTest
                            (ctxt,(xmlSchematronTestPtr_conflict)local_48,instance,root,
                             (xmlSchematronPatternPtr_conflict)rule);
                }
              }
            }
          }
        }
      }
      else {
        for (; root != (xmlNodePtr)0x0; root = xmlSchematronNextNode(root)) {
          for (test = (xmlSchematronTestPtr_conflict)ctxt->schema->rules;
              test != (xmlSchematronTestPtr_conflict)0x0; test = test->next) {
            iVar2 = xmlPatternMatch((xmlPatternPtr)test->report,root);
            if (iVar2 == 1) {
              for (local_48 = test->comp; local_48 != (xmlXPathCompExprPtr)0x0;
                  local_48 = *(xmlXPathCompExprPtr *)local_48) {
                xmlSchematronRunTest
                          (ctxt,(xmlSchematronTestPtr_conflict)local_48,instance,root,
                           (xmlSchematronPatternPtr_conflict)test->report);
              }
            }
          }
        }
      }
      ctxt_local._4_4_ = ctxt->nberrors;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlSchematronValidateDoc(xmlSchematronValidCtxtPtr ctxt, xmlDocPtr instance)
{
    xmlNodePtr cur, root;
    xmlSchematronPatternPtr pattern;
    xmlSchematronRulePtr rule;
    xmlSchematronTestPtr test;

    if ((ctxt == NULL) || (ctxt->schema == NULL) ||
        (ctxt->schema->rules == NULL) || (instance == NULL))
        return(-1);
    ctxt->nberrors = 0;
    root = xmlDocGetRootElement(instance);
    if (root == NULL) {
        TODO
	ctxt->nberrors++;
	return(1);
    }
    if ((ctxt->flags & XML_SCHEMATRON_OUT_QUIET) ||
        (ctxt->flags == 0)) {
	/*
	 * we are just trying to assert the validity of the document,
	 * speed primes over the output, run in a single pass
	 */
	cur = root;
	while (cur != NULL) {
	    rule = ctxt->schema->rules;
	    while (rule != NULL) {
		if (xmlPatternMatch(rule->pattern, cur) == 1) {
		    test = rule->tests;
		    while (test != NULL) {
			xmlSchematronRunTest(ctxt, test, instance, cur, (xmlSchematronPatternPtr)rule->pattern);
			test = test->next;
		    }
		}
		rule = rule->next;
	    }

	    cur = xmlSchematronNextNode(cur);
	}
    } else {
        /*
	 * Process all contexts one at a time
	 */
	pattern = ctxt->schema->patterns;

	while (pattern != NULL) {
	    xmlSchematronReportPattern(ctxt, pattern);

	    /*
	     * TODO convert the pattern rule to a direct XPath and
	     * compute directly instead of using the pattern matching
	     * over the full document...
	     * Check the exact semantic
	     */
	    cur = root;
	    while (cur != NULL) {
		rule = pattern->rules;
		while (rule != NULL) {
		    if (xmlPatternMatch(rule->pattern, cur) == 1) {
			test = rule->tests;
			while (test != NULL) {
			    xmlSchematronRunTest(ctxt, test, instance, cur, pattern);
			    test = test->next;
			}
		    }
		    rule = rule->patnext;
		}

		cur = xmlSchematronNextNode(cur);
	    }
	    pattern = pattern->next;
	}
    }
    return(ctxt->nberrors);
}